

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O1

bool vkt::tessellation::isPatchDiscarded(TessPrimitiveType primitiveType,float *outerLevels)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = true;
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    uVar2 = 3;
  }
  else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    uVar2 = 2;
  }
  else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
    uVar2 = 4;
  }
  else {
    bVar4 = false;
    uVar2 = 0;
  }
  if ((bVar4) && (0.0 < *outerLevels)) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (uVar2 + (uVar2 == 0) == uVar3) break;
      uVar1 = uVar3 + 1;
    } while (0.0 < outerLevels[uVar3]);
    bVar4 = uVar3 < uVar2;
  }
  return bVar4;
}

Assistant:

bool isPatchDiscarded (const TessPrimitiveType primitiveType, const float* outerLevels)
{
	const int numOuterLevels = numOuterTessellationLevels(primitiveType);
	for (int i = 0; i < numOuterLevels; i++)
		if (outerLevels[i] <= 0.0f)
			return true;
	return false;
}